

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O2

void testDwaCompressorSimd(string *param_1)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 (*pauVar27) [32];
  unsigned_short *puVar28;
  undefined1 (*pauVar29) [16];
  void *pvVar30;
  __m128 *g;
  ostream *poVar31;
  void *__s;
  void *__s_00;
  void *__s_01;
  __m128 *b;
  __m128 *r;
  int iter_1;
  uint uVar32;
  long lVar33;
  int i_4;
  int iVar34;
  long lVar35;
  int i_1;
  int i_5;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  char *src1;
  int iter;
  int iVar39;
  ulong uVar40;
  int i;
  long lVar41;
  double dVar43;
  undefined1 auVar44 [16];
  double dVar42;
  undefined1 in_ZMM0 [64];
  undefined1 auVar45 [64];
  undefined1 auVar47 [48];
  undefined1 auVar46 [64];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  half local_112;
  Rand48 rand48;
  bool bStack_10a;
  undefined1 uStack_109;
  Rand48 rand48_2;
  Rand48 rand48_1;
  bool local_ea;
  SimdAlignedBuffer64us dst;
  SimdAlignedBuffer64f local_d8;
  SimdAlignedBuffer64f local_c8;
  void *local_b0;
  SimdAlignedBuffer64f orig [3];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  poVar31 = std::operator<<((ostream *)&std::cout,"SIMD helper functions for DwaCompressor:");
  std::endl<char,std::char_traits<char>>(poVar31);
  rand48._state[0] = 0x5a5a;
  rand48._state[1] = 0x5a5a;
  rand48._state[2]._0_1_ = 0x5a;
  rand48._state[2]._1_1_ = 'Z';
  lVar41 = 0;
  do {
    Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64
              ((SimdAlignedBuffer64<float> *)((long)&orig[0]._buffer + lVar41));
    lVar41 = lVar41 + 0x10;
  } while (lVar41 != 0x30);
  lVar41 = 0;
  do {
    Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64
              ((SimdAlignedBuffer64<float> *)((long)&dst._buffer + lVar41));
    lVar41 = lVar41 + 0x10;
  } while (lVar41 != 0x30);
  poVar31 = std::operator<<((ostream *)&std::cout,"   Color Space Conversion Round Trip ");
  std::endl<char,std::char_traits<char>>(poVar31);
  poVar31 = std::operator<<((ostream *)&std::cout,"      csc709Forward64() - 64 x csc709Inverse()");
  std::endl<char,std::char_traits<char>>(poVar31);
  for (iVar39 = 0; iVar39 != 1000000; iVar39 = iVar39 + 1) {
    for (lVar41 = 0; lVar41 != 0x40; lVar41 = lVar41 + 1) {
      dVar42 = (double)Imath_2_5::erand48(rand48._state);
      *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                          CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_)) + lVar41 * 4) =
           (float)dVar42;
      *(float *)(dst._buffer + lVar41 * 2) = (float)dVar42;
      dVar42 = (double)Imath_2_5::erand48(rand48._state);
      orig[1]._buffer[lVar41] = (float)dVar42;
      local_d8._buffer[lVar41] = (float)dVar42;
      auVar45._0_8_ = (double)Imath_2_5::erand48(rand48._state);
      auVar45._8_56_ = extraout_var;
      in_ZMM0._4_60_ = auVar45._4_60_;
      in_ZMM0._0_4_ = (float)auVar45._0_8_;
      orig[2]._buffer[lVar41] = in_ZMM0._0_4_;
      local_c8._buffer[lVar41] = in_ZMM0._0_4_;
    }
    Imf_2_5::anon_unknown_3::csc709Forward64((float *)dst._buffer,local_d8._buffer,local_c8._buffer)
    ;
    for (lVar41 = 0; lVar41 != 0x40; lVar41 = lVar41 + 1) {
      fVar48 = *(float *)(dst._buffer + lVar41 * 2);
      in_ZMM0._0_16_ = ZEXT416((uint)fVar48);
      fVar3 = local_d8._buffer[lVar41];
      fVar4 = local_c8._buffer[lVar41];
      *(float *)(dst._buffer + lVar41 * 2) = fVar4 * 1.5747 + fVar48;
      local_d8._buffer[lVar41] = fVar4 * -0.4682 + fVar3 * -0.1873 + fVar48;
      local_c8._buffer[lVar41] = fVar3 * 1.8556 + fVar48;
    }
    anon_unknown.dwarf_112c3b::compareBuffer(orig,(SimdAlignedBuffer64f *)&dst,in_ZMM0._0_4_);
    anon_unknown.dwarf_112c3b::compareBuffer(orig + 1,&local_d8,in_ZMM0._0_4_);
    anon_unknown.dwarf_112c3b::compareBuffer(orig + 2,&local_c8,in_ZMM0._0_4_);
  }
  poVar31 = std::operator<<((ostream *)&std::cout,"      csc709Forward64() - csc709Inverse64()");
  std::endl<char,std::char_traits<char>>(poVar31);
  for (iVar39 = 0; iVar39 != 1000000; iVar39 = iVar39 + 1) {
    lVar41 = 0;
    while( true ) {
      auVar47 = in_ZMM0._16_48_;
      if (lVar41 == 0x40) break;
      dVar42 = (double)Imath_2_5::erand48(rand48._state);
      *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                          CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_)) + lVar41 * 4) =
           (float)dVar42;
      *(float *)(dst._buffer + lVar41 * 2) = (float)dVar42;
      dVar42 = (double)Imath_2_5::erand48(rand48._state);
      orig[1]._buffer[lVar41] = (float)dVar42;
      local_d8._buffer[lVar41] = (float)dVar42;
      auVar46._0_8_ = (double)Imath_2_5::erand48(rand48._state);
      auVar46._8_56_ = extraout_var_00;
      in_ZMM0._4_60_ = auVar46._4_60_;
      in_ZMM0._0_4_ = (float)auVar46._0_8_;
      orig[2]._buffer[lVar41] = in_ZMM0._0_4_;
      local_c8._buffer[lVar41] = in_ZMM0._0_4_;
      lVar41 = lVar41 + 1;
    }
    Imf_2_5::anon_unknown_3::csc709Forward64((float *)dst._buffer,local_d8._buffer,local_c8._buffer)
    ;
    fVar48 = *(float *)dst._buffer;
    fVar3 = *(float *)(dst._buffer + 2);
    fVar4 = *(float *)(dst._buffer + 4);
    fVar18 = *(float *)(dst._buffer + 6);
    fVar19 = *local_c8._buffer;
    fVar20 = local_c8._buffer[1];
    fVar21 = local_c8._buffer[2];
    fVar22 = local_c8._buffer[3];
    fVar53 = (float)DAT_001e66f0;
    fVar55 = DAT_001e66f0._4_4_;
    fVar56 = DAT_001e66f0._8_4_;
    fVar57 = DAT_001e66f0._12_4_;
    fVar23 = *local_d8._buffer;
    fVar24 = local_d8._buffer[1];
    fVar25 = local_d8._buffer[2];
    fVar26 = local_d8._buffer[3];
    fVar58 = (float)DAT_001e6700;
    fVar60 = DAT_001e6700._4_4_;
    fVar61 = DAT_001e6700._8_4_;
    fVar62 = DAT_001e6700._12_4_;
    *(float *)dst._buffer = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 2) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 4) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 6) = fVar22 * fVar57 + fVar18;
    fVar63 = (float)DAT_001e6710;
    fVar64 = DAT_001e6710._4_4_;
    fVar65 = DAT_001e6710._8_4_;
    fVar66 = DAT_001e6710._12_4_;
    fVar67 = (float)DAT_001e6720;
    fVar68 = DAT_001e6720._4_4_;
    fVar69 = DAT_001e6720._8_4_;
    fVar70 = DAT_001e6720._12_4_;
    *local_d8._buffer = (fVar48 - *local_d8._buffer * fVar63) - fVar19 * fVar67;
    local_d8._buffer[1] = (fVar3 - local_d8._buffer[1] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[2] = (fVar4 - local_d8._buffer[2] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[3] = (fVar18 - local_d8._buffer[3] * fVar66) - fVar22 * fVar70;
    *local_c8._buffer = fVar23 * fVar58 + fVar48;
    local_c8._buffer[1] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[2] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[3] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 8);
    fVar3 = *(float *)(dst._buffer + 10);
    fVar4 = *(float *)(dst._buffer + 0xc);
    fVar18 = *(float *)(dst._buffer + 0xe);
    fVar19 = local_c8._buffer[4];
    fVar20 = local_c8._buffer[5];
    fVar21 = local_c8._buffer[6];
    fVar22 = local_c8._buffer[7];
    fVar23 = local_d8._buffer[4];
    fVar24 = local_d8._buffer[5];
    fVar25 = local_d8._buffer[6];
    fVar26 = local_d8._buffer[7];
    *(float *)(dst._buffer + 8) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 10) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0xc) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0xe) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[4] = (fVar48 - local_d8._buffer[4] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[5] = (fVar3 - local_d8._buffer[5] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[6] = (fVar4 - local_d8._buffer[6] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[7] = (fVar18 - local_d8._buffer[7] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[4] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[5] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[6] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[7] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x10);
    fVar3 = *(float *)(dst._buffer + 0x12);
    fVar4 = *(float *)(dst._buffer + 0x14);
    fVar18 = *(float *)(dst._buffer + 0x16);
    fVar19 = local_c8._buffer[8];
    fVar20 = local_c8._buffer[9];
    fVar21 = local_c8._buffer[10];
    fVar22 = local_c8._buffer[0xb];
    fVar23 = local_d8._buffer[8];
    fVar24 = local_d8._buffer[9];
    fVar25 = local_d8._buffer[10];
    fVar26 = local_d8._buffer[0xb];
    *(float *)(dst._buffer + 0x10) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x12) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x14) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x16) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[8] = (fVar48 - local_d8._buffer[8] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[9] = (fVar3 - local_d8._buffer[9] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[10] = (fVar4 - local_d8._buffer[10] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0xb] = (fVar18 - local_d8._buffer[0xb] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[8] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[9] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[10] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0xb] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x18);
    fVar3 = *(float *)(dst._buffer + 0x1a);
    fVar4 = *(float *)(dst._buffer + 0x1c);
    fVar18 = *(float *)(dst._buffer + 0x1e);
    fVar19 = local_c8._buffer[0xc];
    fVar20 = local_c8._buffer[0xd];
    fVar21 = local_c8._buffer[0xe];
    fVar22 = local_c8._buffer[0xf];
    fVar23 = local_d8._buffer[0xc];
    fVar24 = local_d8._buffer[0xd];
    fVar25 = local_d8._buffer[0xe];
    fVar26 = local_d8._buffer[0xf];
    *(float *)(dst._buffer + 0x18) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x1a) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x1c) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x1e) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0xc] = (fVar48 - local_d8._buffer[0xc] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0xd] = (fVar3 - local_d8._buffer[0xd] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0xe] = (fVar4 - local_d8._buffer[0xe] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0xf] = (fVar18 - local_d8._buffer[0xf] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0xc] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0xd] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0xe] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0xf] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x20);
    fVar3 = *(float *)(dst._buffer + 0x22);
    fVar4 = *(float *)(dst._buffer + 0x24);
    fVar18 = *(float *)(dst._buffer + 0x26);
    fVar19 = local_c8._buffer[0x10];
    fVar20 = local_c8._buffer[0x11];
    fVar21 = local_c8._buffer[0x12];
    fVar22 = local_c8._buffer[0x13];
    fVar23 = local_d8._buffer[0x10];
    fVar24 = local_d8._buffer[0x11];
    fVar25 = local_d8._buffer[0x12];
    fVar26 = local_d8._buffer[0x13];
    *(float *)(dst._buffer + 0x20) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x22) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x24) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x26) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x10] = (fVar48 - local_d8._buffer[0x10] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x11] = (fVar3 - local_d8._buffer[0x11] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x12] = (fVar4 - local_d8._buffer[0x12] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x13] = (fVar18 - local_d8._buffer[0x13] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x10] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x11] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x12] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x13] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x28);
    fVar3 = *(float *)(dst._buffer + 0x2a);
    fVar4 = *(float *)(dst._buffer + 0x2c);
    fVar18 = *(float *)(dst._buffer + 0x2e);
    fVar19 = local_c8._buffer[0x14];
    fVar20 = local_c8._buffer[0x15];
    fVar21 = local_c8._buffer[0x16];
    fVar22 = local_c8._buffer[0x17];
    fVar23 = local_d8._buffer[0x14];
    fVar24 = local_d8._buffer[0x15];
    fVar25 = local_d8._buffer[0x16];
    fVar26 = local_d8._buffer[0x17];
    *(float *)(dst._buffer + 0x28) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x2a) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x2c) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x2e) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x14] = (fVar48 - local_d8._buffer[0x14] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x15] = (fVar3 - local_d8._buffer[0x15] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x16] = (fVar4 - local_d8._buffer[0x16] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x17] = (fVar18 - local_d8._buffer[0x17] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x14] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x15] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x16] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x17] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x30);
    fVar3 = *(float *)(dst._buffer + 0x32);
    fVar4 = *(float *)(dst._buffer + 0x34);
    fVar18 = *(float *)(dst._buffer + 0x36);
    fVar19 = local_c8._buffer[0x18];
    fVar20 = local_c8._buffer[0x19];
    fVar21 = local_c8._buffer[0x1a];
    fVar22 = local_c8._buffer[0x1b];
    fVar23 = local_d8._buffer[0x18];
    fVar24 = local_d8._buffer[0x19];
    fVar25 = local_d8._buffer[0x1a];
    fVar26 = local_d8._buffer[0x1b];
    *(float *)(dst._buffer + 0x30) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x32) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x34) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x36) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x18] = (fVar48 - local_d8._buffer[0x18] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x19] = (fVar3 - local_d8._buffer[0x19] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x1a] = (fVar4 - local_d8._buffer[0x1a] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x1b] = (fVar18 - local_d8._buffer[0x1b] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x18] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x19] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x1a] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x1b] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x38);
    fVar3 = *(float *)(dst._buffer + 0x3a);
    fVar4 = *(float *)(dst._buffer + 0x3c);
    fVar18 = *(float *)(dst._buffer + 0x3e);
    fVar19 = local_c8._buffer[0x1c];
    fVar20 = local_c8._buffer[0x1d];
    fVar21 = local_c8._buffer[0x1e];
    fVar22 = local_c8._buffer[0x1f];
    fVar23 = local_d8._buffer[0x1c];
    fVar24 = local_d8._buffer[0x1d];
    fVar25 = local_d8._buffer[0x1e];
    fVar26 = local_d8._buffer[0x1f];
    *(float *)(dst._buffer + 0x38) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x3a) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x3c) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x3e) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x1c] = (fVar48 - local_d8._buffer[0x1c] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x1d] = (fVar3 - local_d8._buffer[0x1d] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x1e] = (fVar4 - local_d8._buffer[0x1e] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x1f] = (fVar18 - local_d8._buffer[0x1f] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x1c] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x1d] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x1e] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x1f] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x40);
    fVar3 = *(float *)(dst._buffer + 0x42);
    fVar4 = *(float *)(dst._buffer + 0x44);
    fVar18 = *(float *)(dst._buffer + 0x46);
    fVar19 = local_c8._buffer[0x20];
    fVar20 = local_c8._buffer[0x21];
    fVar21 = local_c8._buffer[0x22];
    fVar22 = local_c8._buffer[0x23];
    fVar23 = local_d8._buffer[0x20];
    fVar24 = local_d8._buffer[0x21];
    fVar25 = local_d8._buffer[0x22];
    fVar26 = local_d8._buffer[0x23];
    *(float *)(dst._buffer + 0x40) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x42) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x44) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x46) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x20] = (fVar48 - local_d8._buffer[0x20] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x21] = (fVar3 - local_d8._buffer[0x21] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x22] = (fVar4 - local_d8._buffer[0x22] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x23] = (fVar18 - local_d8._buffer[0x23] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x20] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x21] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x22] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x23] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x48);
    fVar3 = *(float *)(dst._buffer + 0x4a);
    fVar4 = *(float *)(dst._buffer + 0x4c);
    fVar18 = *(float *)(dst._buffer + 0x4e);
    fVar19 = local_c8._buffer[0x24];
    fVar20 = local_c8._buffer[0x25];
    fVar21 = local_c8._buffer[0x26];
    fVar22 = local_c8._buffer[0x27];
    fVar23 = local_d8._buffer[0x24];
    fVar24 = local_d8._buffer[0x25];
    fVar25 = local_d8._buffer[0x26];
    fVar26 = local_d8._buffer[0x27];
    *(float *)(dst._buffer + 0x48) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x4a) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x4c) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x4e) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x24] = (fVar48 - local_d8._buffer[0x24] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x25] = (fVar3 - local_d8._buffer[0x25] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x26] = (fVar4 - local_d8._buffer[0x26] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x27] = (fVar18 - local_d8._buffer[0x27] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x24] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x25] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x26] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x27] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x50);
    fVar3 = *(float *)(dst._buffer + 0x52);
    fVar4 = *(float *)(dst._buffer + 0x54);
    fVar18 = *(float *)(dst._buffer + 0x56);
    fVar19 = local_c8._buffer[0x28];
    fVar20 = local_c8._buffer[0x29];
    fVar21 = local_c8._buffer[0x2a];
    fVar22 = local_c8._buffer[0x2b];
    fVar23 = local_d8._buffer[0x28];
    fVar24 = local_d8._buffer[0x29];
    fVar25 = local_d8._buffer[0x2a];
    fVar26 = local_d8._buffer[0x2b];
    *(float *)(dst._buffer + 0x50) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x52) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x54) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x56) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x28] = (fVar48 - local_d8._buffer[0x28] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x29] = (fVar3 - local_d8._buffer[0x29] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x2a] = (fVar4 - local_d8._buffer[0x2a] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x2b] = (fVar18 - local_d8._buffer[0x2b] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x28] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x29] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x2a] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x2b] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x58);
    fVar3 = *(float *)(dst._buffer + 0x5a);
    fVar4 = *(float *)(dst._buffer + 0x5c);
    fVar18 = *(float *)(dst._buffer + 0x5e);
    fVar19 = local_c8._buffer[0x2c];
    fVar20 = local_c8._buffer[0x2d];
    fVar21 = local_c8._buffer[0x2e];
    fVar22 = local_c8._buffer[0x2f];
    fVar23 = local_d8._buffer[0x2c];
    fVar24 = local_d8._buffer[0x2d];
    fVar25 = local_d8._buffer[0x2e];
    fVar26 = local_d8._buffer[0x2f];
    *(float *)(dst._buffer + 0x58) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x5a) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x5c) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x5e) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x2c] = (fVar48 - local_d8._buffer[0x2c] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x2d] = (fVar3 - local_d8._buffer[0x2d] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x2e] = (fVar4 - local_d8._buffer[0x2e] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x2f] = (fVar18 - local_d8._buffer[0x2f] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x2c] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x2d] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x2e] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x2f] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x60);
    fVar3 = *(float *)(dst._buffer + 0x62);
    fVar4 = *(float *)(dst._buffer + 100);
    fVar18 = *(float *)(dst._buffer + 0x66);
    fVar19 = local_c8._buffer[0x30];
    fVar20 = local_c8._buffer[0x31];
    fVar21 = local_c8._buffer[0x32];
    fVar22 = local_c8._buffer[0x33];
    fVar23 = local_d8._buffer[0x30];
    fVar24 = local_d8._buffer[0x31];
    fVar25 = local_d8._buffer[0x32];
    fVar26 = local_d8._buffer[0x33];
    *(float *)(dst._buffer + 0x60) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x62) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 100) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x66) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x30] = (fVar48 - local_d8._buffer[0x30] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x31] = (fVar3 - local_d8._buffer[0x31] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x32] = (fVar4 - local_d8._buffer[0x32] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x33] = (fVar18 - local_d8._buffer[0x33] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x30] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x31] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x32] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x33] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x68);
    fVar3 = *(float *)(dst._buffer + 0x6a);
    fVar4 = *(float *)(dst._buffer + 0x6c);
    fVar18 = *(float *)(dst._buffer + 0x6e);
    fVar19 = local_c8._buffer[0x34];
    fVar20 = local_c8._buffer[0x35];
    fVar21 = local_c8._buffer[0x36];
    fVar22 = local_c8._buffer[0x37];
    fVar23 = local_d8._buffer[0x34];
    fVar24 = local_d8._buffer[0x35];
    fVar25 = local_d8._buffer[0x36];
    fVar26 = local_d8._buffer[0x37];
    *(float *)(dst._buffer + 0x68) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x6a) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x6c) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x6e) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x34] = (fVar48 - local_d8._buffer[0x34] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x35] = (fVar3 - local_d8._buffer[0x35] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x36] = (fVar4 - local_d8._buffer[0x36] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x37] = (fVar18 - local_d8._buffer[0x37] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x34] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x35] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x36] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x37] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x70);
    fVar3 = *(float *)(dst._buffer + 0x72);
    fVar4 = *(float *)(dst._buffer + 0x74);
    fVar18 = *(float *)(dst._buffer + 0x76);
    fVar19 = local_c8._buffer[0x38];
    fVar20 = local_c8._buffer[0x39];
    fVar21 = local_c8._buffer[0x3a];
    fVar22 = local_c8._buffer[0x3b];
    fVar23 = local_d8._buffer[0x38];
    fVar24 = local_d8._buffer[0x39];
    fVar25 = local_d8._buffer[0x3a];
    fVar26 = local_d8._buffer[0x3b];
    *(float *)(dst._buffer + 0x70) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x72) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x74) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x76) = fVar22 * fVar57 + fVar18;
    local_d8._buffer[0x38] = (fVar48 - local_d8._buffer[0x38] * fVar63) - fVar19 * fVar67;
    local_d8._buffer[0x39] = (fVar3 - local_d8._buffer[0x39] * fVar64) - fVar20 * fVar68;
    local_d8._buffer[0x3a] = (fVar4 - local_d8._buffer[0x3a] * fVar65) - fVar21 * fVar69;
    local_d8._buffer[0x3b] = (fVar18 - local_d8._buffer[0x3b] * fVar66) - fVar22 * fVar70;
    local_c8._buffer[0x38] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x39] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x3a] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x3b] = fVar26 * fVar62 + fVar18;
    fVar48 = *(float *)(dst._buffer + 0x78);
    fVar3 = *(float *)(dst._buffer + 0x7a);
    fVar4 = *(float *)(dst._buffer + 0x7c);
    fVar18 = *(float *)(dst._buffer + 0x7e);
    fVar19 = local_c8._buffer[0x3c];
    fVar20 = local_c8._buffer[0x3d];
    fVar21 = local_c8._buffer[0x3e];
    fVar22 = local_c8._buffer[0x3f];
    fVar23 = local_d8._buffer[0x3c];
    fVar24 = local_d8._buffer[0x3d];
    fVar25 = local_d8._buffer[0x3e];
    fVar26 = local_d8._buffer[0x3f];
    *(float *)(dst._buffer + 0x78) = fVar19 * fVar53 + fVar48;
    *(float *)(dst._buffer + 0x7a) = fVar20 * fVar55 + fVar3;
    *(float *)(dst._buffer + 0x7c) = fVar21 * fVar56 + fVar4;
    *(float *)(dst._buffer + 0x7e) = fVar22 * fVar57 + fVar18;
    auVar44._0_4_ = (fVar48 - local_d8._buffer[0x3c] * fVar63) - fVar19 * fVar67;
    auVar44._4_4_ = (fVar3 - local_d8._buffer[0x3d] * fVar64) - fVar20 * fVar68;
    auVar44._8_4_ = (fVar4 - local_d8._buffer[0x3e] * fVar65) - fVar21 * fVar69;
    auVar44._12_4_ = (fVar18 - local_d8._buffer[0x3f] * fVar66) - fVar22 * fVar70;
    in_ZMM0._16_48_ = auVar47;
    in_ZMM0._0_16_ = auVar44;
    *(undefined1 (*) [16])(local_d8._buffer + 0x3c) = auVar44;
    local_c8._buffer[0x3c] = fVar23 * fVar58 + fVar48;
    local_c8._buffer[0x3d] = fVar24 * fVar60 + fVar3;
    local_c8._buffer[0x3e] = fVar25 * fVar61 + fVar4;
    local_c8._buffer[0x3f] = fVar26 * fVar62 + fVar18;
    anon_unknown.dwarf_112c3b::compareBuffer(orig,(SimdAlignedBuffer64f *)&dst,auVar44._0_4_);
    anon_unknown.dwarf_112c3b::compareBuffer(orig + 1,&local_d8,in_ZMM0._0_4_);
    anon_unknown.dwarf_112c3b::compareBuffer(orig + 2,&local_c8,in_ZMM0._0_4_);
  }
  lVar41 = 0x20;
  do {
    Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64
              ((SimdAlignedBuffer64<float> *)((long)&dst._buffer + lVar41));
    lVar41 = lVar41 + -0x10;
  } while (lVar41 != -0x10);
  lVar41 = 0x20;
  do {
    Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64
              ((SimdAlignedBuffer64<float> *)((long)&orig[0]._buffer + lVar41));
    lVar41 = lVar41 + -0x10;
  } while (lVar41 != -0x10);
  orig[0]._buffer._0_4_ = 0x5a5a5a5a;
  orig[0]._buffer._4_2_ = 0x5a5a;
  __s = operator_new__(100000);
  local_b0 = operator_new__(100000);
  __s_00 = operator_new__(200000);
  __s_01 = operator_new__(200000);
  poVar31 = std::operator<<((ostream *)&std::cout,"   Byte Interleaving ");
  std::endl<char,std::char_traits<char>>(poVar31);
  lVar41 = 0;
  while( true ) {
    if (lVar41 == 100000) break;
    dVar42 = Imath_2_5::Rand48::nextf((Rand48 *)orig,0.0,255.0);
    *(char *)((long)__s + lVar41) = (char)(int)dVar42;
    dVar43 = Imath_2_5::Rand48::nextf((Rand48 *)orig,0.0,255.0);
    *(char *)((long)local_b0 + lVar41) = (char)(int)dVar43;
    *(char *)((long)__s_00 + lVar41 * 2) = (char)(int)dVar42;
    *(char *)((long)__s_00 + lVar41 * 2 + 1) = (char)(int)dVar43;
    lVar41 = lVar41 + 1;
  }
  iVar39 = 0;
  do {
    if (iVar39 == 10000) {
      lVar41 = 10;
      lVar33 = 1;
      do {
        if (lVar33 == 0x80) {
          operator_delete__(__s);
          operator_delete__(local_b0);
          operator_delete__(__s_00);
          operator_delete__(__s_01);
          poVar31 = std::operator<<((ostream *)&std::cout,"   FLOAT -> HALF conversion");
          std::endl<char,std::char_traits<char>>(poVar31);
          rand48_1._state[0] = 0x5a5a;
          rand48_1._state[1] = 0x5a5a;
          rand48_1._state[2] = 0x5a5a;
          Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64(orig);
          Imf_2_5::SimdAlignedBuffer64<unsigned_short>::SimdAlignedBuffer64(&dst);
          poVar31 = std::operator<<((ostream *)&std::cout,"      convertFloatToHalf64_scalar()");
          std::endl<char,std::char_traits<char>>(poVar31);
          iVar39 = 0;
          do {
            if (iVar39 == 1000000) {
              Imf_2_5::CpuId::CpuId((CpuId *)&rand48);
              if ((rand48._state[2]._1_1_ == '\x01') && (bStack_10a == true)) {
                poVar31 = std::operator<<((ostream *)&std::cout,"      convertFloatToHalf64_f16c()")
                ;
                std::endl<char,std::char_traits<char>>(poVar31);
                for (iVar39 = 0; iVar39 != 1000000; iVar39 = iVar39 + 1) {
                  for (uVar37 = 0; uVar37 != 0x40; uVar37 = uVar37 + 1) {
                    if (uVar37 < 0x20) {
                      dVar42 = (double)Imath_2_5::erand48(rand48_1._state);
                      dVar42 = (dVar42 + -0.5) * 140000.0;
                    }
                    else {
                      dVar42 = (double)Imath_2_5::erand48(rand48_1._state);
                      dVar42 = dVar42 + -0.5;
                    }
                    *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                                        CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_)) +
                              uVar37 * 4) = (float)dVar42;
                    dst._buffer[uVar37] = 0;
                  }
                  pauVar27 = (undefined1 (*) [32])
                             CONCAT26(orig[0]._buffer._6_2_,
                                      CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_));
                  auVar44 = vcvtps2ph_f16c(*pauVar27,0);
                  auVar49 = vcvtps2ph_f16c(pauVar27[1],0);
                  auVar50 = vcvtps2ph_f16c(pauVar27[2],0);
                  auVar51 = vcvtps2ph_f16c(pauVar27[3],0);
                  *(undefined1 (*) [16])dst._buffer = auVar44;
                  *(undefined1 (*) [16])(dst._buffer + 8) = auVar49;
                  *(undefined1 (*) [16])(dst._buffer + 0x10) = auVar50;
                  *(undefined1 (*) [16])(dst._buffer + 0x18) = auVar51;
                  auVar44 = vcvtps2ph_f16c(pauVar27[4],0);
                  auVar49 = vcvtps2ph_f16c(pauVar27[5],0);
                  auVar50 = vcvtps2ph_f16c(pauVar27[6],0);
                  auVar51 = vcvtps2ph_f16c(pauVar27[7],0);
                  *(undefined1 (*) [16])(dst._buffer + 0x20) = auVar44;
                  *(undefined1 (*) [16])(dst._buffer + 0x28) = auVar49;
                  *(undefined1 (*) [16])(dst._buffer + 0x30) = auVar50;
                  *(undefined1 (*) [16])(dst._buffer + 0x38) = auVar51;
                  for (lVar41 = 0; lVar41 != 0x40; lVar41 = lVar41 + 1) {
                    half::half((half *)&rand48_2,
                               *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                                                   CONCAT24(orig[0]._buffer._4_2_,
                                                            orig[0]._buffer._0_4_)) + lVar41 * 4));
                    if (rand48_2._state[0] != dst._buffer[lVar41]) {
                      poVar31 = (ostream *)
                                std::ostream::operator<<
                                          (&std::cout,
                                           *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                                                               CONCAT24(orig[0]._buffer._4_2_,
                                                                        orig[0]._buffer._0_4_)) +
                                                     lVar41 * 4));
                      poVar31 = std::operator<<(poVar31," -> ");
                      poVar31 = (ostream *)std::ostream::operator<<(poVar31,dst._buffer[lVar41]);
                      poVar31 = std::operator<<(poVar31," expected ");
                      poVar31 = (ostream *)std::ostream::operator<<(poVar31,rand48_2._state[0]);
                      std::endl<char,std::char_traits<char>>(poVar31);
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                                    ,0x1a9,"void (anonymous namespace)::testFloatToHalf()");
                    }
                  }
                }
              }
              Imf_2_5::SimdAlignedBuffer64<unsigned_short>::~SimdAlignedBuffer64(&dst);
              Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64(orig);
              Imf_2_5::SimdAlignedBuffer64<unsigned_short>::SimdAlignedBuffer64
                        ((SimdAlignedBuffer64<unsigned_short> *)orig);
              Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64
                        ((SimdAlignedBuffer64<float> *)&dst);
              poVar31 = std::operator<<((ostream *)&std::cout,
                                        "   ZigZag re-ordering with HALF -> FLOAT conversion");
              std::endl<char,std::char_traits<char>>(poVar31);
              poVar31 = std::operator<<((ostream *)&std::cout,"      fromHalfZigZag_scaler()");
              std::endl<char,std::char_traits<char>>(poVar31);
              puVar28 = (unsigned_short *)
                        CONCAT26(orig[0]._buffer._6_2_,
                                 CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_));
              for (lVar41 = 0; lVar41 != 0x80; lVar41 = lVar41 + 2) {
                *(undefined2 *)((long)puVar28 + lVar41) =
                     *(undefined2 *)((long)&DAT_001e6ee0 + lVar41);
              }
              Imf_2_5::anon_unknown_3::fromHalfZigZag_scalar(puVar28,(float *)dst._buffer);
              lVar41 = 0;
              while( true ) {
                if (lVar41 == 0x40) {
                  Imf_2_5::CpuId::CpuId((CpuId *)&rand48_1);
                  if ((rand48_1._state[2]._1_1_ == '\x01') && (local_ea == true)) {
                    rand48_2._state[0] = 0x5a5a;
                    rand48_2._state[1] = 0x5a5a;
                    rand48_2._state[2] = 0x5a5a;
                    Imf_2_5::SimdAlignedBuffer64<float>::SimdAlignedBuffer64
                              ((SimdAlignedBuffer64<float> *)&rand48);
                    poVar31 = std::operator<<((ostream *)&std::cout,"      fromHalfZigZag_f16c()");
                    std::endl<char,std::char_traits<char>>(poVar31);
                    for (iVar39 = 0; iVar39 != 1000000; iVar39 = iVar39 + 1) {
                      for (uVar37 = 0; uVar37 != 0x40; uVar37 = uVar37 + 1) {
                        if (uVar37 < 0x20) {
                          dVar42 = (double)Imath_2_5::erand48(rand48_2._state);
                          half::half(&local_112,(float)((dVar42 + -0.5) * 140000.0));
                        }
                        else {
                          dVar42 = (double)Imath_2_5::erand48(rand48_2._state);
                          half::half(&local_112,(float)(dVar42 + -0.5));
                        }
                        *(unsigned_short *)
                         (CONCAT26(orig[0]._buffer._6_2_,
                                   CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_)) +
                         uVar37 * 2) = local_112._h;
                      }
                      Imf_2_5::anon_unknown_3::fromHalfZigZag_scalar
                                ((unsigned_short *)
                                 CONCAT26(orig[0]._buffer._6_2_,
                                          CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_)),
                                 (float *)dst._buffer);
                      pauVar29 = (undefined1 (*) [16])
                                 CONCAT26(orig[0]._buffer._6_2_,
                                          CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_));
                      pauVar27 = (undefined1 (*) [32])
                                 CONCAT17(uStack_109,
                                          CONCAT16(bStack_10a,
                                                   CONCAT15(rand48._state[2]._1_1_,
                                                            CONCAT14((undefined1)rand48._state[2],
                                                                     CONCAT22(rand48._state[1],
                                                                              rand48._state[0])))));
                      auVar44 = *pauVar29;
                      auVar49 = pauVar29[7];
                      auVar50 = vpsrldq_avx(auVar44,2);
                      auVar51 = vpslldq_avx(auVar44,4);
                      auVar44 = vpalignr_avx(auVar44,*(undefined1 (*) [16])(pauVar29[4] + 6),2);
                      auVar50 = vpblendw_avx(auVar50,*(undefined1 (*) [16])(pauVar29[5] + 2),0xfc);
                      auVar51 = vpblendw_avx(auVar51,*(undefined1 (*) [16])(pauVar29[6] + 2),0x1f);
                      auVar54 = vpsrldq_avx(auVar49,4);
                      auVar59 = vpslldq_avx(auVar49,2);
                      auVar49 = vpalignr_avx(*(undefined1 (*) [16])(pauVar29[2] + 10),auVar49,0xe);
                      auVar54 = vpblendw_avx(auVar54,*(undefined1 (*) [16])(*pauVar29 + 0xe),0xf8);
                      auVar59 = vpblendw_avx(auVar59,*(undefined1 (*) [16])(pauVar29[1] + 0xe),0x3f)
                      ;
                      auVar52._8_8_ = 0;
                      auVar52._0_8_ = *(ulong *)(*pauVar29 + 0xc);
                      auVar52 = vpinsrq_avx(auVar52,*(undefined8 *)(pauVar29[6] + 0xc),1);
                      auVar44 = vpshuflw_avx(auVar44,0x1b);
                      auVar51 = vpshuflw_avx(auVar51,0x1b);
                      auVar54 = vpshuflw_avx(auVar54,0x1b);
                      auVar5 = vpshuflw_avx(auVar49,0x1b);
                      auVar44 = vpshufhw_avx(auVar44,0x1b);
                      auVar49 = vpshufhw_avx(auVar51,0x1b);
                      auVar51 = vpshufhw_avx(auVar54,0x1b);
                      auVar54 = vpshufhw_avx(auVar5,0x1b);
                      auVar44 = vpshufd_avx(auVar44,0x4e);
                      auVar49 = vpshufd_avx(auVar49,0x4e);
                      auVar51 = vpshufd_avx(auVar51,0x4e);
                      auVar54 = vpshufd_avx(auVar54,0x4e);
                      auVar5 = vpunpcklwd_avx(auVar44,auVar50);
                      auVar6 = vpunpcklwd_avx(auVar49,auVar52);
                      auVar7 = vpunpcklwd_avx(auVar51,auVar59);
                      auVar8 = vpunpcklwd_avx(auVar54,*(undefined1 (*) [16])(pauVar29[3] + 8));
                      auVar44 = vpunpckhwd_avx(auVar44,auVar50);
                      auVar49 = vpunpckhwd_avx(auVar49,auVar52);
                      auVar50 = vpunpckhwd_avx(auVar51,auVar59);
                      auVar51 = vpunpckhwd_avx(auVar54,*(undefined1 (*) [16])(pauVar29[3] + 8));
                      auVar52 = vpunpckldq_avx(auVar5,auVar6);
                      auVar9 = vpunpckldq_avx(auVar7,auVar8);
                      auVar54 = vpunpckhdq_avx(auVar5,auVar6);
                      auVar59 = vpunpckhdq_avx(auVar7,auVar8);
                      auVar5 = vpunpckldq_avx(auVar44,auVar49);
                      auVar6 = vpunpckldq_avx(auVar50,auVar51);
                      auVar44 = vpunpckhdq_avx(auVar44,auVar49);
                      auVar49 = vpunpckhdq_avx(auVar50,auVar51);
                      auVar7 = vpunpcklqdq_avx(auVar52,auVar9);
                      auVar50 = vpunpckhqdq_avx(auVar52,auVar9);
                      auVar52 = vpunpcklqdq_avx(auVar54,auVar59);
                      auVar51 = vpunpckhqdq_avx(auVar54,auVar59);
                      auVar8 = vpunpcklqdq_avx(auVar6,auVar5);
                      auVar54 = vpunpckhqdq_avx(auVar5,auVar6);
                      auVar5 = vpunpcklqdq_avx(auVar44,auVar49);
                      auVar59 = vpunpckhqdq_avx(auVar44,auVar49);
                      auVar44 = vpalignr_avx(auVar50,auVar50,2);
                      auVar49 = vpalignr_avx(auVar52,auVar52,4);
                      auVar50 = vpalignr_avx(auVar51,auVar51,6);
                      auVar51 = vpalignr_avx(auVar54,auVar54,10);
                      auVar54 = vpalignr_avx(auVar5,auVar5,0xc);
                      auVar59 = vpalignr_avx(auVar59,auVar59,0xe);
                      auVar10 = vcvtph2ps_f16c(auVar7);
                      auVar11 = vcvtph2ps_f16c(auVar44);
                      auVar12 = vcvtph2ps_f16c(auVar49);
                      auVar13 = vcvtph2ps_f16c(auVar50);
                      auVar14 = vcvtph2ps_f16c(auVar8);
                      auVar15 = vcvtph2ps_f16c(auVar51);
                      auVar16 = vcvtph2ps_f16c(auVar54);
                      auVar17 = vcvtph2ps_f16c(auVar59);
                      *pauVar27 = auVar10;
                      pauVar27[1] = auVar11;
                      pauVar27[2] = auVar12;
                      pauVar27[3] = auVar13;
                      pauVar27[4] = auVar14;
                      pauVar27[5] = auVar15;
                      pauVar27[6] = auVar16;
                      pauVar27[7] = auVar17;
                      for (lVar41 = 0; lVar41 != 0x40; lVar41 = lVar41 + 1) {
                        if (1e-05 < ABS(*(float *)(dst._buffer + lVar41 * 2) -
                                        *(float *)(CONCAT17(uStack_109,
                                                            CONCAT16(bStack_10a,
                                                                     CONCAT15(rand48._state[2]._1_1_
                                                                              ,CONCAT14((undefined1)
                                                                                        rand48.
                                                  _state[2],
                                                  CONCAT22(rand48._state[1],rand48._state[0]))))) +
                                                  lVar41 * 4))) {
                          poVar31 = std::operator<<((ostream *)&std::cout,"At index ");
                          poVar31 = (ostream *)std::ostream::operator<<(poVar31,(int)lVar41);
                          std::operator<<(poVar31,": ");
                          poVar31 = std::operator<<((ostream *)&std::cout,"expecting ");
                          poVar31 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar31,*(float *)(dst._buffer + lVar41 * 2));
                          poVar31 = std::operator<<(poVar31,"; got ");
                          poVar31 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar31,*(float *)(CONCAT17(uStack_109,
                                                                           CONCAT16(bStack_10a,
                                                                                    CONCAT15(rand48.
                                                  _state[2]._1_1_,
                                                  CONCAT14((undefined1)rand48._state[2],
                                                           CONCAT22(rand48._state[1],
                                                                    rand48._state[0]))))) +
                                                  lVar41 * 4));
                          std::endl<char,std::char_traits<char>>(poVar31);
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                                        ,0x1fd,"void (anonymous namespace)::testFromHalfZigZag()");
                        }
                      }
                    }
                    Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64
                              ((SimdAlignedBuffer64<float> *)&rand48);
                  }
                  Imf_2_5::SimdAlignedBuffer64<float>::~SimdAlignedBuffer64
                            ((SimdAlignedBuffer64<float> *)&dst);
                  Imf_2_5::SimdAlignedBuffer64<unsigned_short>::~SimdAlignedBuffer64
                            ((SimdAlignedBuffer64<unsigned_short> *)orig);
                  anon_unknown.dwarf_112c3b::testDct();
                  poVar31 = std::operator<<((ostream *)&std::cout,"ok\n");
                  std::endl<char,std::char_traits<char>>(poVar31);
                  return;
                }
                fVar48 = (float)(int)lVar41;
                if (1e-05 < ABS(*(float *)(dst._buffer + lVar41 * 2) - fVar48)) break;
                lVar41 = lVar41 + 1;
              }
              poVar31 = std::operator<<((ostream *)&std::cout,"At index ");
              poVar31 = (ostream *)std::ostream::operator<<(poVar31,(int)lVar41);
              std::operator<<(poVar31,": ");
              poVar31 = std::operator<<((ostream *)&std::cout,"expecting ");
              poVar31 = (ostream *)std::ostream::operator<<(poVar31,fVar48);
              poVar31 = std::operator<<(poVar31,"; got ");
              poVar31 = (ostream *)
                        std::ostream::operator<<(poVar31,*(float *)(dst._buffer + lVar41 * 2));
              std::endl<char,std::char_traits<char>>(poVar31);
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                            ,0x1d5,"void (anonymous namespace)::testFromHalfZigZag()");
            }
            for (uVar37 = 0; puVar28 = dst._buffer, uVar37 != 0x40; uVar37 = uVar37 + 1) {
              if (uVar37 < 0x20) {
                dVar42 = (double)Imath_2_5::erand48(rand48_1._state);
                dVar42 = (dVar42 + -0.5) * 140000.0;
              }
              else {
                dVar42 = (double)Imath_2_5::erand48(rand48_1._state);
                dVar42 = dVar42 + -0.5;
              }
              *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                                  CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_)) +
                        uVar37 * 4) = (float)dVar42;
              dst._buffer[uVar37] = 0;
            }
            lVar41 = CONCAT26(orig[0]._buffer._6_2_,
                              CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_));
            for (lVar33 = 0; lVar33 != 0x40; lVar33 = lVar33 + 1) {
              half::half((half *)&rand48,*(float *)(lVar41 + lVar33 * 4));
              puVar28[lVar33] = rand48._state[0];
            }
            for (lVar41 = 0; lVar41 != 0x40; lVar41 = lVar41 + 1) {
              half::half((half *)&rand48,
                         *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                                             CONCAT24(orig[0]._buffer._4_2_,orig[0]._buffer._0_4_))
                                   + lVar41 * 4));
              if (rand48._state[0] != dst._buffer[lVar41]) {
                poVar31 = (ostream *)
                          std::ostream::operator<<
                                    (&std::cout,
                                     *(float *)(CONCAT26(orig[0]._buffer._6_2_,
                                                         CONCAT24(orig[0]._buffer._4_2_,
                                                                  orig[0]._buffer._0_4_)) +
                                               lVar41 * 4));
                poVar31 = std::operator<<(poVar31," -> ");
                poVar31 = (ostream *)std::ostream::operator<<(poVar31,dst._buffer[lVar41]);
                poVar31 = std::operator<<(poVar31," expected ");
                poVar31 = (ostream *)std::ostream::operator<<(poVar31,rand48._state[0]);
                std::endl<char,std::char_traits<char>>(poVar31);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                              ,0x187,"void (anonymous namespace)::testFloatToHalf()");
              }
            }
            iVar39 = iVar39 + 1;
          } while( true );
        }
        uVar40 = 0;
        uVar37 = 0;
        while (pvVar30 = local_b0, uVar32 = (uint)uVar37, uVar32 != 0x1000) {
          uVar38 = (ulong)((uint)(uVar37 >> 4) & 0xf);
          uVar37 = (ulong)(uVar32 & 0xf);
          memset(__s,0xff,100000);
          memset(local_b0,0xff,100000);
          memset(__s_00,0,200000);
          memset(__s_01,0,200000);
          src1 = (char *)(uVar38 + (long)local_b0);
          for (lVar35 = 0; lVar33 != lVar35; lVar35 = lVar35 + 1) {
            dVar42 = Imath_2_5::Rand48::nextf((Rand48 *)orig,0.0,255.0);
            *(char *)((long)__s + lVar35 + uVar37) = (char)(int)dVar42;
            dVar42 = Imath_2_5::Rand48::nextf((Rand48 *)orig,0.0,255.0);
            *(char *)((long)pvVar30 + lVar35 + uVar38) = (char)(int)dVar42;
            *(undefined1 *)((long)__s_00 + lVar35 * 2) =
                 *(undefined1 *)((long)__s + lVar35 + uVar37);
            *(char *)((long)__s_00 + lVar35 * 2 + 1) = (char)(int)dVar42;
          }
          Imf_2_5::anon_unknown_3::interleaveByte2
                    ((char *)((ulong)(uVar32 >> 8) + (long)__s_01),(char *)(uVar37 + (long)__s),src1
                     ,(int)lVar33);
          lVar35 = 0;
          while (lVar41 != lVar35) {
            if (*(char *)((long)__s_00 + lVar35 * 2) !=
                *(char *)((long)__s_01 + lVar35 * 2 + (uVar40 >> 8))) {
              __assert_fail("dst[2*i] == out[2*i]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                            ,0xf5,"void (anonymous namespace)::testInterleave()");
            }
            lVar2 = lVar35 * 2;
            lVar1 = lVar35 * 2;
            lVar35 = lVar35 + 1;
            if (*(char *)((long)__s_00 + lVar2 + 1) !=
                *(char *)((long)__s_01 + lVar1 + (uVar40 >> 8) + 1)) {
              __assert_fail("dst[2*i+1] == out[2*i+1]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                            ,0xf6,"void (anonymous namespace)::testInterleave()");
            }
          }
          uVar40 = uVar40 + 1;
          uVar37 = (ulong)(uVar32 + 1);
        }
        lVar33 = lVar33 + 1;
        lVar41 = lVar41 + 2;
      } while( true );
    }
    memset(__s_01,0,200000);
    dVar42 = Imath_2_5::Rand48::nextf((Rand48 *)orig,0.0,50000.0);
    iVar34 = (int)dVar42;
    dVar42 = Imath_2_5::Rand48::nextf((Rand48 *)orig,1.0,(double)(99999 - iVar34));
    uVar32 = (uint)dVar42;
    Imf_2_5::anon_unknown_3::interleaveByte2
              ((char *)((long)(iVar34 * 2) + (long)__s_01),(char *)((long)__s + (long)iVar34),
               (char *)((long)iVar34 + (long)local_b0),uVar32);
    if ((int)uVar32 < 1) {
      uVar32 = 0;
    }
    lVar41 = (ulong)uVar32 + 1;
    iVar34 = iVar34 * 2;
    while( true ) {
      lVar41 = lVar41 + -1;
      if (lVar41 == 0) break;
      if (*(char *)((long)__s_01 + (long)iVar34) != *(char *)((long)__s_00 + (long)iVar34)) {
        __assert_fail("test[2*offset + 2*i] == dst[2*offset + 2*i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                      ,0xce,"void (anonymous namespace)::testInterleave()");
      }
      iVar36 = iVar34 + 1;
      iVar34 = iVar34 + 2;
      if (*(char *)((long)__s_01 + (long)iVar36) != *(char *)((long)__s_00 + (long)iVar36)) {
        __assert_fail("test[2*offset + 2*i + 1] == dst[2*offset + 2*i + 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                      ,0xcf,"void (anonymous namespace)::testInterleave()");
      }
    }
    iVar39 = iVar39 + 1;
  } while( true );
}

Assistant:

void 
testDwaCompressorSimd (const string&)
{
    cout << "SIMD helper functions for DwaCompressor:" << endl;

    try
    {
    
        testCsc();
        testInterleave();
        testFloatToHalf();
        testFromHalfZigZag();

        testDct();

    }
    catch (const exception &e)
    {
        cout << "unexpected exception: " << e.what() << endl;
        assert (false);
    }
    catch (...)
    {
        cout << "unexpected exception" << endl;
        assert (false);
    }

    cout << "ok\n" << endl;
}